

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

size_t rtosc_amessage(char *buffer,size_t len,char *address,char *arguments,rtosc_arg_t *args)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  int64_t iVar4;
  char cVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  size_t __n;
  char *pcVar15;
  
  sVar7 = strlen(address);
  sVar8 = strlen(arguments);
  uVar12 = ((int)sVar8 + ((int)sVar7 + 4U & 0xfffffffc) + 1 & 0xfffffffc) + 4;
  uVar6 = nreserved(arguments);
  if (uVar6 != 0) {
    uVar10 = 0;
    pcVar15 = arguments;
    do {
      switch(*pcVar15) {
      case 'b':
        uVar12 = uVar12 + args[uVar10].i + 7 & 0xfffffffc;
        break;
      case 'c':
      case 'f':
      case 'i':
      case 'm':
      case 'r':
        goto LAB_00101ec2;
      case 'd':
      case 'h':
      case 't':
        uVar12 = uVar12 + 8;
        break;
      case 'e':
      case 'g':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
        goto switchD_00101e92_caseD_65;
      case 's':
switchD_00101e92_caseD_73:
        sVar7 = strlen(args[uVar10].s);
        uVar12 = uVar12 + (int)sVar7 & 0xfffffffc;
LAB_00101ec2:
        uVar12 = uVar12 + 4;
        break;
      default:
        if (*pcVar15 == 'S') goto switchD_00101e92_caseD_73;
        goto switchD_00101e92_caseD_65;
      }
      uVar10 = uVar10 + 1;
      uVar6 = uVar6 - 1;
switchD_00101e92_caseD_65:
      pcVar15 = pcVar15 + 1;
    } while (uVar6 != 0);
  }
  __n = (size_t)uVar12;
  if (buffer != (char *)0x0) {
    if (len < __n) {
      __n = 0;
      memset(buffer,0,len);
    }
    else {
      uVar6 = 0;
      memset(buffer,0,__n);
      cVar5 = *address;
      if (cVar5 != '\0') {
        uVar14 = 0;
        do {
          buffer[uVar14 & 0xffffffff] = cVar5;
          cVar5 = address[uVar14 + 1];
          uVar14 = uVar14 + 1;
        } while (cVar5 != '\0');
        uVar6 = (uint)uVar14 & 0xfffffffc;
      }
      uVar12 = uVar6 + 5;
      buffer[uVar6 + 4] = ',';
      cVar5 = *arguments;
      pcVar15 = arguments;
      while (cVar5 != '\0') {
        pcVar15 = pcVar15 + 1;
        uVar14 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        buffer[uVar14] = cVar5;
        cVar5 = *pcVar15;
      }
      uVar6 = (uVar12 & 0xfffffffc) + 4;
      uVar12 = nreserved(arguments);
      if (uVar12 != 0) {
        uVar10 = 0;
        do {
          switch(*arguments) {
          case 'b':
            iVar3 = args[uVar10].i;
            lVar9 = *(long *)((long)args + (ulong)uVar10 * 0x10 + 8);
            buffer[uVar6] = (char)((uint)iVar3 >> 0x18);
            buffer[uVar6 + 1] = (char)((uint)iVar3 >> 0x10);
            buffer[uVar6 + 2] = (char)((uint)iVar3 >> 8);
            iVar13 = uVar6 + 4;
            buffer[uVar6 + 3] = (char)iVar3;
            if (lVar9 == 0) {
              iVar13 = iVar3 + iVar13;
            }
            else if (iVar3 != 0) {
              lVar11 = 0;
              do {
                buffer[(uint)(iVar13 + (int)lVar11)] = *(char *)(lVar9 + lVar11);
                lVar11 = lVar11 + 1;
              } while (iVar3 != (int)lVar11);
              iVar13 = iVar13 + (int)lVar11;
            }
            uVar6 = iVar13 + 3U & 0xfffffffc;
            break;
          case 'c':
          case 'f':
          case 'i':
          case 'r':
            iVar2 = args[uVar10].i;
            buffer[uVar6] = (char)((uint)iVar2 >> 0x18);
            buffer[uVar6 + 1] = (char)((uint)iVar2 >> 0x10);
            uVar1 = uVar6 + 3;
            buffer[uVar6 + 2] = (char)((uint)iVar2 >> 8);
            uVar6 = uVar6 + 4;
            buffer[uVar1] = (char)iVar2;
            break;
          case 'd':
          case 'h':
          case 't':
            iVar4 = args[uVar10].h;
            buffer[uVar6] = (char)((ulong)iVar4 >> 0x38);
            buffer[uVar6 + 1] = (char)((ulong)iVar4 >> 0x30);
            buffer[uVar6 + 2] = (char)((ulong)iVar4 >> 0x28);
            buffer[uVar6 + 3] = (char)((ulong)iVar4 >> 0x20);
            buffer[uVar6 + 4] = (char)((ulong)iVar4 >> 0x18);
            buffer[uVar6 + 5] = (char)((ulong)iVar4 >> 0x10);
            uVar1 = uVar6 + 7;
            buffer[uVar6 + 6] = (char)((ulong)iVar4 >> 8);
            uVar6 = uVar6 + 8;
            buffer[uVar1] = (char)iVar4;
            break;
          case 'e':
          case 'g':
          case 'j':
          case 'k':
          case 'l':
          case 'n':
          case 'o':
          case 'p':
          case 'q':
            goto switchD_00101fb6_caseD_65;
          case 'm':
            lVar9 = (ulong)uVar10 * 0x10;
            buffer[uVar6] = args[uVar10].T;
            buffer[uVar6 + 1] = args->m[lVar9 + 1];
            uVar1 = uVar6 + 3;
            buffer[uVar6 + 2] = args->m[lVar9 + 2];
            uVar6 = uVar6 + 4;
            buffer[uVar1] = args->m[lVar9 + 3];
            break;
          case 's':
switchD_00101fb6_caseD_73:
            pcVar15 = args[uVar10].s;
            cVar5 = *pcVar15;
            while (cVar5 != '\0') {
              pcVar15 = pcVar15 + 1;
              uVar14 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
              buffer[uVar14] = cVar5;
              cVar5 = *pcVar15;
            }
            uVar6 = (uVar6 & 0xfffffffc) + 4;
            break;
          default:
            if (*arguments == 'S') goto switchD_00101fb6_caseD_73;
            goto switchD_00101fb6_caseD_65;
          }
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
switchD_00101fb6_caseD_65:
          arguments = arguments + 1;
        } while (uVar12 != 0);
      }
      __n = (size_t)uVar6;
    }
  }
  return __n;
}

Assistant:

size_t rtosc_amessage(char              *buffer,
                      size_t             len,
                      const char        *address,
                      const char        *arguments,
                      const rtosc_arg_t *args)
{
    const size_t total_len = vsosc_null(address, arguments, args);

    if(!buffer)
        return total_len;

    //Abort if the message cannot fit
    if(total_len>len) {
        memset(buffer, 0, len);
        return 0;
    }

    memset(buffer, 0, total_len);

    unsigned pos = 0;
    while(*address)
        buffer[pos++] = *address++;

    //get 32 bit alignment
    pos += 4-pos%4;

    buffer[pos++] = ',';

    const char *arg_str = arguments;
    while(*arg_str)
        buffer[pos++] = *arg_str++;

    pos += 4-pos%4;

    unsigned toparse = nreserved(arguments);
    unsigned arg_pos = 0;
    while(toparse)
    {
        char arg = *arguments++;
        assert(arg);
        int32_t i;
        int64_t d;
        const uint8_t *m;
        const char *s;
        const unsigned char *u;
        rtosc_blob_t b;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                d = args[arg_pos++].t;
                buffer[pos++] = ((d>>56) & 0xff);
                buffer[pos++] = ((d>>48) & 0xff);
                buffer[pos++] = ((d>>40) & 0xff);
                buffer[pos++] = ((d>>32) & 0xff);
                buffer[pos++] = ((d>>24) & 0xff);
                buffer[pos++] = ((d>>16) & 0xff);
                buffer[pos++] = ((d>>8) & 0xff);
                buffer[pos++] = (d & 0xff);
                --toparse;
                break;
            case 'r':
            case 'f':
            case 'c':
            case 'i':
                i = args[arg_pos++].i;
                buffer[pos++] = ((i>>24) & 0xff);
                buffer[pos++] = ((i>>16) & 0xff);
                buffer[pos++] = ((i>>8) & 0xff);
                buffer[pos++] = (i & 0xff);
                --toparse;
                break;
            case 'm':
                //TODO verify ordering of spec
                m = args[arg_pos++].m;
                buffer[pos++] = m[0];
                buffer[pos++] = m[1];
                buffer[pos++] = m[2];
                buffer[pos++] = m[3];
                --toparse;
                break;
            case 'S':
            case 's':
                s = args[arg_pos++].s;
                while(*s)
                    buffer[pos++] = *s++;
                pos += 4-pos%4;
                --toparse;
                break;
            case 'b':
                b = args[arg_pos++].b;
                i = b.len;
                buffer[pos++] = ((i>>24) & 0xff);
                buffer[pos++] = ((i>>16) & 0xff);
                buffer[pos++] = ((i>>8) & 0xff);
                buffer[pos++] = (i & 0xff);
                u = b.data;
                if(u) {
                    while(i--)
                        buffer[pos++] = *u++;
                }
                else
                    pos += i;
                if(pos%4)
                    pos += 4-pos%4;
                --toparse;
                break;
            default:
                ;
        }
    }

    return pos;
}